

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O2

void TPZBlackOilAnalysis::Flow
               (TPZBlackOilAnalysis *an,int matid,double *WaterFlowSC,double *OilFlowSC,
               double *WaterFlowBottom,double *OilFlowBottom)

{
  TPZFNMatrix<1000,_double> *this;
  double dVar1;
  uint uVar2;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar3;
  int iVar4;
  TPZFMatrix<double> *pTVar5;
  TPZCompEl **ppTVar6;
  long *plVar7;
  TPZGeoEl *pTVar8;
  TPZGeoEl *pTVar9;
  undefined8 uVar10;
  long lVar11;
  TPZBlackOil2P3D *this_00;
  double *pdVar12;
  ulong uVar13;
  ulong nelem;
  STATE SVar14;
  TPZVec<double> sol;
  TPZVec<double> qsi;
  TFad<4,_double> local_8740;
  TFad<4,_double> local_8710;
  BFadREAL local_86e0;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  
  pTVar5 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                     (&(an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.
                       fSolution);
  (*(an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.super_TPZSavable.
    _vptr_TPZSavable[0xd])(an,pTVar5);
  mesh = (an->super_TPZNonLinearAnalysis).super_TPZLinearAnalysis.super_TPZAnalysis.fCompMesh;
  TPZVec<double>::TPZVec(&qsi,3);
  TPZVec<double>::TPZVec(&sol,1);
  TPZElementMatrixT<double>::TPZElementMatrixT(&ek,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT(&ef,mesh,EF);
  uVar2 = (uint)(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  *WaterFlowSC = 0.0;
  *OilFlowSC = 0.0;
  *WaterFlowBottom = 0.0;
  *OilFlowBottom = 0.0;
  this = &ef.fMat;
  nelem = 0;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar13 = nelem;
  }
  for (; uVar13 != nelem; nelem = nelem + 1) {
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    pTVar3 = *ppTVar6;
    if (pTVar3 != (TPZCompEl *)0x0) {
      plVar7 = (long *)(**(code **)(*(long *)pTVar3 + 0xb8))(pTVar3);
      iVar4 = (**(code **)(*plVar7 + 0x58))(plVar7);
      if ((iVar4 == matid) &&
         (plVar7 = (long *)__dynamic_cast(pTVar3,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo
                                          ,0), plVar7 != (long *)0x0)) {
        (**(code **)(*plVar7 + 0x108))(plVar7,&ek,&ef);
        pTVar8 = TPZCompEl::Reference((TPZCompEl *)plVar7[5]);
        pTVar9 = TPZCompEl::Reference((TPZCompEl *)plVar7[5]);
        iVar4 = (**(code **)(*(long *)pTVar9 + 0xf0))(pTVar9);
        (**(code **)(*(long *)pTVar8 + 0x260))(pTVar8,iVar4 + -1,&qsi);
        (**(code **)(*(long *)plVar7[5] + 0x1b0))((long *)plVar7[5],&qsi,2,&sol);
        local_8740.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0170f530;
        local_8740.val_ = *sol.fStore;
        local_8740.dx_[1] = 0.0;
        local_8740.dx_[2] = 0.0;
        local_8740.dx_[3] = 0.0;
        local_8740.dx_[0] = 1.0;
        local_86e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0170f530;
        local_86e0.dx_[1] = 0.0;
        local_86e0.dx_[2] = 0.0;
        local_86e0.val_ = 0.0;
        local_86e0.dx_[0] = 0.0;
        local_86e0.dx_[3] = 0.0;
        uVar10 = (**(code **)(*plVar7 + 0xb8))(plVar7);
        plVar7 = (long *)__dynamic_cast(uVar10,&TPZMaterial::typeinfo,&TPZBndCondT<double>::typeinfo
                                        ,0xfffffffffffffffe);
        lVar11 = (**(code **)(*plVar7 + 0x50))(plVar7);
        if (lVar11 == 0) {
          this_00 = (TPZBlackOil2P3D *)0x0;
        }
        else {
          this_00 = (TPZBlackOil2P3D *)
                    __dynamic_cast(lVar11,&TPZMaterial::typeinfo,&TPZBlackOil2P3D::typeinfo,0);
        }
        TFad<4,_double>::TFad(&local_8710,&local_8740);
        TPZBlackOil2P3D::Bo(this_00,&local_8710,&local_86e0);
        local_8710.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0170f530;
        pdVar12 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,0);
        *OilFlowSC = *pdVar12 * 86400.0 + *OilFlowSC;
        pdVar12 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,0);
        *WaterFlowSC = *pdVar12 * 86400.0 + *WaterFlowSC;
        pdVar12 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,0);
        *OilFlowBottom = *pdVar12 * local_86e0.val_ * 86400.0 + *OilFlowBottom;
        pdVar12 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,0);
        dVar1 = *pdVar12;
        SVar14 = TPZBlackOil2P3D::Bw(this_00);
        *WaterFlowBottom = dVar1 * SVar14 * 86400.0 + *WaterFlowBottom;
      }
    }
  }
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ek);
  TPZVec<double>::~TPZVec(&sol);
  TPZVec<double>::~TPZVec(&qsi);
  return;
}

Assistant:

void TPZBlackOilAnalysis::Flow(TPZBlackOilAnalysis &an, int matid, double & WaterFlowSC, double  & OilFlowSC, double & WaterFlowBottom, double  & OilFlowBottom){
	
	an.LoadSolution(an.Solution());
	TPZCompMesh * cmesh = an.Mesh();
	TPZVec<REAL> qsi(3);
    TPZVec<STATE> sol(1);
	
	TPZElementMatrixT<STATE> ek(cmesh, TPZElementMatrix::EK), ef(cmesh, TPZElementMatrix::EF);
	const int nel = cmesh->NElements();
	WaterFlowSC = 0.;
	OilFlowSC = 0.;
	WaterFlowBottom = 0.;
	OilFlowBottom = 0.;
	for(int iel = 0; iel < nel; iel++){
		TPZCompEl * cel = cmesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Material()->Id() != matid) continue;
		TPZInterfaceElement * face = dynamic_cast<TPZInterfaceElement*>(cel);
		if(!face) continue;
		face->CalcStiff(ek, ef);
		
		face->LeftElement()->Reference()->CenterPoint(face->LeftElement()->Reference()->NSides()-1,qsi);
		face->LeftElement()->Solution(qsi, TPZBlackOil2P3D::EOilPressure, sol);
		
		TPZBlackOil2P3D::BFadREAL po(sol[0],0);
		TPZBlackOil2P3D::BFadREAL Bo;
		
		auto * bc =
			dynamic_cast<TPZBndCondT<STATE>*> (face->Material());
		auto * bo =
			dynamic_cast<TPZBlackOil2P3D *> (bc->Material());
		bo->Bo(po, Bo);
		
		OilFlowSC += ef.fMat(0,0)*86400.;
		WaterFlowSC += ef.fMat(1,0)*86400.;
		
		OilFlowBottom += ef.fMat(0,0)*Bo.val()*86400.;
		WaterFlowBottom += ef.fMat(1,0)*bo->Bw()*86400.;
	}//iel
}